

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall
dtc::fdt::property::parse_cells(property *this,text_input_buffer *input,int cell_size)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  unsigned_long_long uVar4;
  char *msg_00;
  size_type sVar5;
  byte bVar6;
  value_type_conflict1 local_279;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  string msg;
  unsigned_long_long val;
  property_value local_1f0;
  string local_190;
  property_value local_170;
  string local_110;
  string local_f0;
  string local_d0 [8];
  string referenced;
  string local_a0;
  undefined1 local_80 [8];
  property_value v;
  int cell_size_local;
  text_input_buffer *input_local;
  property *this_local;
  
  v._92_4_ = cell_size;
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 != '<') {
    __assert_fail("*input == \'<\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x11b,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
  }
  text_input_buffer::operator++(input);
  std::__cxx11::string::string((string *)&local_a0);
  property_value::property_value((property_value *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  text_input_buffer::next_token(input);
  do {
    while( true ) {
      bVar2 = text_input_buffer::consume(input,'>');
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           ((long)&v.string_data.field_2 + 8));
        if (sVar5 != 0) {
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(&this->values,(value_type *)local_80);
        }
        referenced.field_2._8_4_ = 0;
        goto LAB_00180b56;
      }
      text_input_buffer::next_token(input);
      bVar2 = text_input_buffer::consume(input,'&');
      if (bVar2) break;
      bVar2 = text_input_buffer::consume_integer_expression
                        (input,(unsigned_long_long *)(msg.field_2._M_local_buf + 8));
      if (!bVar2) {
        text_input_buffer::parse_error(input,"Expected numbers in array of cells");
        this->valid = false;
        referenced.field_2._8_4_ = 1;
        goto LAB_00180b56;
      }
      if ((((int)v._92_4_ < 0x40) &&
          (bVar6 = v._92_1_,
          (ulong)(1L << (bVar6 & 0x3f)) <=
          CONCAT44(msg.field_2._12_4_,
                   CONCAT22(msg.field_2._10_2_,
                            CONCAT11(msg.field_2._M_local_buf[9],msg.field_2._M_local_buf[8]))))) &&
         (uVar3 = CONCAT44(msg.field_2._12_4_,
                           CONCAT22(msg.field_2._10_2_,
                                    CONCAT11(msg.field_2._M_local_buf[9],msg.field_2._M_local_buf[8]
                                            ))),
         uVar4 = std::numeric_limits<unsigned_long_long>::max(),
         (uVar3 | (1L << (bVar6 - 1 & 0x3f)) - 1U) != uVar4)) {
        std::__cxx11::to_string(&local_278,v._92_4_);
        std::operator+(&local_258,"Value does not fit in a ",&local_278);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238,&local_258,"-bit cell");
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        msg_00 = (char *)std::__cxx11::string::c_str();
        text_input_buffer::parse_error(input,msg_00);
        this->valid = false;
        referenced.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)local_238);
        goto LAB_00180b56;
      }
      if (v._92_4_ == 8) {
        local_279 = msg.field_2._M_local_buf[8];
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&v.string_data.field_2 + 8),&local_279);
      }
      else if (v._92_4_ == 0x10) {
        push_big_endian<unsigned_short>
                  ((byte_buffer *)((long)&v.string_data.field_2 + 8),
                   CONCAT11(msg.field_2._M_local_buf[9],msg.field_2._M_local_buf[8]));
      }
      else if (v._92_4_ == 0x20) {
        push_big_endian<unsigned_int>
                  ((byte_buffer *)((long)&v.string_data.field_2 + 8),
                   CONCAT22(msg.field_2._10_2_,
                            CONCAT11(msg.field_2._M_local_buf[9],msg.field_2._M_local_buf[8])));
      }
      else {
        if (v._92_4_ != 0x40) {
          __assert_fail("0 && \"Invalid cell size!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc"
                        ,0x176,"void dtc::fdt::property::parse_cells(text_input_buffer &, int)");
        }
        push_big_endian<unsigned_long>
                  ((byte_buffer *)((long)&v.string_data.field_2 + 8),
                   CONCAT44(msg.field_2._12_4_,
                            CONCAT22(msg.field_2._10_2_,
                                     CONCAT11(msg.field_2._M_local_buf[9],
                                              msg.field_2._M_local_buf[8]))));
      }
      text_input_buffer::next_token(input);
    }
    if (v._92_4_ != 0x20) {
      text_input_buffer::parse_error(input,"reference only permitted in 32-bit arrays");
      this->valid = false;
      referenced.field_2._8_4_ = 1;
      break;
    }
    text_input_buffer::next_token(input);
    std::__cxx11::string::string(local_d0);
    bVar2 = text_input_buffer::consume(input,'{');
    if (bVar2) {
      text_input_buffer::parse_to_abi_cxx11_(&local_110,input,'}');
      std::__cxx11::string::operator=(local_d0,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      text_input_buffer::consume(input,'}');
    }
    else {
      text_input_buffer::parse_node_name_abi_cxx11_(&local_f0,input);
      std::__cxx11::string::operator=(local_d0,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      text_input_buffer::next_token(input);
      bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)&v.string_data.field_2 + 8));
      if (!bVar2) {
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (&this->values,(value_type *)local_80);
        std::__cxx11::string::string((string *)&local_190);
        property_value::property_value(&local_170,&local_190);
        property_value::operator=((property_value *)local_80,&local_170);
        property_value::~property_value(&local_170);
        std::__cxx11::string::~string((string *)&local_190);
      }
      std::__cxx11::string::operator=((string *)(v.label.field_2._M_local_buf + 8),local_d0);
      v.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                (&this->values,(value_type *)local_80);
      std::__cxx11::string::string((string *)&val);
      property_value::property_value(&local_1f0,(string *)&val);
      property_value::operator=((property_value *)local_80,&local_1f0);
      property_value::~property_value(&local_1f0);
      std::__cxx11::string::~string((string *)&val);
      referenced.field_2._8_4_ = 0;
    }
    else {
      text_input_buffer::parse_error(input,"Expected node name");
      this->valid = false;
      referenced.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string(local_d0);
  } while (referenced.field_2._8_4_ == 0);
LAB_00180b56:
  property_value::~property_value((property_value *)local_80);
  return;
}

Assistant:

void
property::parse_cells(text_input_buffer &input, int cell_size)
{
	assert(*input == '<');
	++input;
	property_value v;
	input.next_token();
	while (!input.consume('>'))
	{
		input.next_token();
		// If this is a phandle then we need to get the name of the
		// referenced node
		if (input.consume('&'))
		{
			if (cell_size != 32)
			{
				input.parse_error("reference only permitted in 32-bit arrays");
				valid = false;
				return;
			}
			input.next_token();
			string referenced;
			if (!input.consume('{'))
			{
				referenced = input.parse_node_name();
			}
			else
			{
				referenced = input.parse_to('}');
				input.consume('}');
			}
			if (referenced.empty())
			{
				input.parse_error("Expected node name");
				valid = false;
				return;
			}
			input.next_token();
			// If we already have some bytes, make the phandle a
			// separate component.
			if (!v.byte_data.empty())
			{
				values.push_back(v);
				v = property_value();
			}
			v.string_data = referenced;
			v.type = property_value::PHANDLE;
			values.push_back(v);
			v = property_value();
		}
		else
		{
			//FIXME: We should support labels in the middle
			//of these, but we don't.
			unsigned long long val;
			if (!input.consume_integer_expression(val))
			{
				// FIXME: Distinguish invalid syntax from a
				// number that cannot be represented in an
				// unsigned long long.
				input.parse_error("Expected numbers in array of cells");
				valid = false;
				return;
			}
			// FIXME: No sign information available, so cannot
			// distinguish small negative values from large
			// positive ones, and thus we have to conservatively
			// permit anything that looks like a sign-extended
			// negative integer.
			if (cell_size < 64 && val >= (1ull << cell_size) &&
			    (val | ((1ull << (cell_size - 1)) - 1)) !=
			    std::numeric_limits<unsigned long long>::max())
			{
				std::string msg = "Value does not fit in a " +
					std::to_string(cell_size) + "-bit cell";
				input.parse_error(msg.c_str());
				valid = false;
				return;
			}
			switch (cell_size)
			{
				case 8:
					v.byte_data.push_back(val);
					break;
				case 16:
					push_big_endian(v.byte_data, (uint16_t)val);
					break;
				case 32:
					push_big_endian(v.byte_data, (uint32_t)val);
					break;
				case 64:
					push_big_endian(v.byte_data, (uint64_t)val);
					break;
				default:
					assert(0 && "Invalid cell size!");
			}
			input.next_token();
		}
	}
	// Don't store an empty string value here.
	if (v.byte_data.size() > 0)
	{
		values.push_back(v);
	}
}